

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CopyPtr.h
# Opt level: O2

CopyPtr<slang::AssociativeArray> * __thiscall
slang::CopyPtr<slang::AssociativeArray>::operator=
          (CopyPtr<slang::AssociativeArray> *this,CopyPtr<slang::AssociativeArray> *other)

{
  AssociativeArray *pAVar1;
  
  if (this != other) {
    pAVar1 = this->ptr;
    if (pAVar1 != (AssociativeArray *)0x0) {
      AssociativeArray::~AssociativeArray(pAVar1);
    }
    operator_delete(pAVar1,0x58);
    pAVar1 = other->ptr;
    other->ptr = (AssociativeArray *)0x0;
    this->ptr = pAVar1;
  }
  return this;
}

Assistant:

CopyPtr& operator=(CopyPtr&& other) noexcept {
        if (this != &other) {
            delete ptr;
            ptr = std::exchange(other.ptr, nullptr);
        }
        return *this;
    }